

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O1

void __thiscall
Centaurus::CompositeATN<char>::build_wildcard_closure
          (CompositeATN<char> *this,CATNClosure *closure,Identifier *id,int color,
          ATNStateStack *stack,PriorityChain *priority)

{
  Identifier *id_00;
  pointer ppVar1;
  pointer pwVar2;
  bool bVar3;
  int iVar4;
  SimpleException *this_00;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  _Hash_node_base *p_Var8;
  int index;
  ulong uVar9;
  undefined1 local_50 [16];
  _func_int *local_40 [2];
  
  p_Var6 = (this->m_dict)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      p_Var8 = p_Var6[7]._M_nxt;
      uVar5 = ((long)p_Var6[8]._M_nxt - (long)p_Var8 >> 4) * -0x3333333333333333;
      if (0 < (int)uVar5) {
        id_00 = (Identifier *)(p_Var6 + 1);
        lVar7 = 0x20;
        uVar9 = 0;
        do {
          if (uVar5 <= uVar9) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          bVar3 = Identifier::operator==((Identifier *)((long)&p_Var8->_M_nxt + lVar7),id);
          if (bVar3) {
            index = (int)uVar9;
            iVar4 = ATNPath::count(stack,id_00,index);
            if (1 < iVar4) {
              this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
              local_50._0_8_ = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,"Upward sentinel reached.","");
              SimpleException::SimpleException(this_00,(string *)local_50);
              __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
            }
            local_50._0_4_ = index;
            std::
            vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
            ::emplace_back<Centaurus::Identifier_const&,int&>
                      ((vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
                        *)&stack->
                           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       ,id_00,(int *)local_50);
            ATNPath::ATNPath((ATNPath *)local_50,id_00,index);
            build_closure_exclusive(this,closure,(ATNPath *)local_50,color,stack,priority);
            std::
            vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ::~vector((vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                       *)(local_50 + 8));
            ppVar1 = (stack->
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ).
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            (stack->
            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ).
            super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
            ppVar1[-1].first._vptr_Identifier = (_func_int **)&PTR__Identifier_0019ece0;
            pwVar2 = ppVar1[-1].first.m_id._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)pwVar2 != &ppVar1[-1].first.m_id.field_2) {
              operator_delete(pwVar2);
            }
          }
          uVar9 = uVar9 + 1;
          p_Var8 = p_Var6[7]._M_nxt;
          uVar5 = ((long)p_Var6[8]._M_nxt - (long)p_Var8 >> 4) * -0x3333333333333333;
          lVar7 = lVar7 + 0x50;
        } while ((long)uVar9 < (long)(int)uVar5);
      }
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_wildcard_closure(CATNClosure& closure, const Identifier& id, int color, ATNStateStack& stack, const PriorityChain& priority) const
{
    //std::wcout << L"Wildcard " << id << L":" << color << std::endl;

    for (const auto& p : m_dict)
    {
        for (int i = 0; i < p.second.get_num_nodes(); i++)
        {
            const CATNNode<TCHAR>& node = p.second[i];

            if (node.get_submachine() == id)
            {
                if (stack.count(p.first, i) >= 2)
                {
                    //std::cout << "Upward sentinel reached." << std::endl;
                    throw SimpleException("Upward sentinel reached.");
                    //continue;
                }
                stack.push(p.first, i);
                build_closure_exclusive(closure, ATNPath(p.first, i), color, stack, priority);
                stack.pop();
            }
        }
    }
}